

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceBitfieldExtract_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType valueDataType,DataType offsetDataType,DataType bitsDataType
          )

{
  bool bVar1;
  ContextType ctxType;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  ostringstream source;
  undefined1 auStack_298 [8];
  string *local_290;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  shaderType_00 = shaderType;
  local_290 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  __s = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_298 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0xf0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  getShaderInitialization_abi_cxx11_
            (&local_1c8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    ",4);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"value","");
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_1e8,shaderType,&local_208);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    ",4);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"offset","");
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_228,valueDataType,&local_248);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    ",4);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"bits","");
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_268,offsetDataType,&local_288);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_268._M_dataplus._M_p,local_268._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"    bitfieldExtract(value, offset, bits);\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_290;
}

Assistant:

std::string genShaderSourceBitfieldExtract (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType valueDataType, glu::DataType offsetDataType, glu::DataType bitsDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(valueDataType, "value")
			<< "    " << declareAndInitializeShaderVariable(offsetDataType, "offset")
			<< "    " << declareAndInitializeShaderVariable(bitsDataType, "bits")
			<< "    bitfieldExtract(value, offset, bits);\n"
			<< "}\n";

	return source.str();
}